

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O1

void __thiscall amrex::MLABecLaplacian::applyMetricTermsCoeffs(MLABecLaplacian *this)

{
  return;
}

Assistant:

void
MLABecLaplacian::applyMetricTermsCoeffs ()
{
#if (AMREX_SPACEDIM != 3)
    for (int alev = 0; alev < m_num_amr_levels; ++alev)
    {
        const int mglev = 0;
        applyMetricTermToMF(alev, mglev, m_a_coeffs[alev][mglev]);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            applyMetricTermToMF(alev, mglev, m_b_coeffs[alev][mglev][idim]);
        }
    }
#endif
}